

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall sjtu::runtime_error::~runtime_error(runtime_error *this)

{
  (this->super_exception)._vptr_exception = (_func_int **)&PTR_what_abi_cxx11__0011d8d0;
  std::__cxx11::string::~string((string *)&this->wro);
  exception::~exception(&this->super_exception);
  return;
}

Assistant:

runtime_error() {
	    wro = "runtime_error";
	}